

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O3

int ffpky(fitsfile *fptr,int datatype,char *keyname,void *value,char *comm,int *status)

{
  ulong value_00;
  char errmsg [81];
  char acStack_68 [88];
  
  if (0 < *status) {
    return *status;
  }
  if (0x27 < datatype) {
    if (datatype < 0x50) {
      if (datatype == 0x28) goto switchD_001aaa61_caseD_50;
      if (datatype == 0x29) goto switchD_001aaa61_caseD_51;
      if (datatype == 0x2a) {
        ffpkye(fptr,keyname,*value,-7,comm,status);
        goto LAB_001aab77;
      }
switchD_001aaa36_caseD_d:
      snprintf(acStack_68,0x51,"Bad keyword datatype code: %d (ffpky)",(ulong)(uint)datatype);
      ffpmsg(acStack_68);
      *status = 0x19a;
    }
    else {
      switch(datatype) {
      case 0x50:
switchD_001aaa61_caseD_50:
        ffpkyuj(fptr,keyname,*value,comm,status);
        break;
      case 0x51:
switchD_001aaa61_caseD_51:
        value_00 = *value;
        goto LAB_001aab66;
      case 0x52:
        ffpkyd(fptr,keyname,*value,-0xf,comm,status);
        break;
      case 0x53:
        ffpkyc(fptr,keyname,(float *)value,-7,comm,status);
        break;
      default:
        if (datatype == 0xa3) {
          ffpkym(fptr,keyname,(double *)value,-0xf,comm,status);
          break;
        }
        goto switchD_001aaa36_caseD_d;
      }
    }
    goto LAB_001aab77;
  }
  switch(datatype) {
  case 0xb:
    value_00 = (ulong)*value;
    break;
  case 0xc:
    value_00 = (ulong)*value;
    break;
  case 0xd:
  case 0xf:
  case 0x11:
  case 0x12:
  case 0x13:
    goto switchD_001aaa36_caseD_d;
  case 0xe:
    ffpkyl(fptr,keyname,*value,comm,status);
    goto LAB_001aab77;
  case 0x10:
    ffpkys(fptr,keyname,(char *)value,comm,status);
    goto LAB_001aab77;
  case 0x14:
    value_00 = (ulong)*value;
    break;
  case 0x15:
    value_00 = (ulong)*value;
    break;
  default:
    if (datatype == 0x1e) {
      ffpkyg(fptr,keyname,(double)*value,0,comm,status);
      goto LAB_001aab77;
    }
    if (datatype != 0x1f) goto switchD_001aaa36_caseD_d;
    value_00 = (ulong)*value;
  }
LAB_001aab66:
  ffpkyj(fptr,keyname,value_00,comm,status);
LAB_001aab77:
  return *status;
}

Assistant:

int ffpky( fitsfile *fptr,     /* I - FITS file pointer        */
           int  datatype,      /* I - datatype of the value    */
           const char *keyname,/* I - name of keyword to write */
           void *value,        /* I - keyword value            */
           const char *comm,   /* I - keyword comment          */
           int  *status)       /* IO - error status            */
/*
  Write (put) the keyword, value and comment into the FITS header.
  Writes a keyword value with the datatype specified by the 2nd argument.
*/
{
    char errmsg[FLEN_ERRMSG];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (datatype == TSTRING)
    {
        ffpkys(fptr, keyname, (char *) value, comm, status);
    }
    else if (datatype == TBYTE)
    {
        ffpkyj(fptr, keyname, (LONGLONG) *(unsigned char *) value, comm, status);
    }
    else if (datatype == TSBYTE)
    {
        ffpkyj(fptr, keyname, (LONGLONG) *(signed char *) value, comm, status);
    }
    else if (datatype == TUSHORT)
    {
        ffpkyj(fptr, keyname, (LONGLONG) *(unsigned short *) value, comm, status);
    }
    else if (datatype == TSHORT)
    {
        ffpkyj(fptr, keyname, (LONGLONG) *(short *) value, comm, status);
    }
    else if (datatype == TUINT)
    {
        ffpkyg(fptr, keyname, (double) *(unsigned int *) value, 0,
               comm, status);
    }
    else if (datatype == TINT)
    {
        ffpkyj(fptr, keyname, (LONGLONG) *(int *) value, comm, status);
    }
    else if (datatype == TLOGICAL)
    {
        ffpkyl(fptr, keyname, *(int *) value, comm, status);
    }
    else if (datatype == TULONG)
    {
        ffpkyuj(fptr, keyname, (ULONGLONG) *(unsigned long *) value,
               comm, status);
    }
    else if (datatype == TULONGLONG)
    {
        ffpkyuj(fptr, keyname, (ULONGLONG) *(ULONGLONG *) value,
               comm, status);
    }
    else if (datatype == TLONG)
    {
        ffpkyj(fptr, keyname, (LONGLONG) *(long *) value, comm, status);
    }
    else if (datatype == TLONGLONG)
    {
        ffpkyj(fptr, keyname, *(LONGLONG *) value, comm, status);
    }
    else if (datatype == TFLOAT)
    {
        ffpkye(fptr, keyname, *(float *) value, -7, comm, status);
    }
    else if (datatype == TDOUBLE)
    {
        ffpkyd(fptr, keyname, *(double *) value, -15, comm, status);
    }
    else if (datatype == TCOMPLEX)
    {
        ffpkyc(fptr, keyname, (float *) value, -7, comm, status);
    }
    else if (datatype == TDBLCOMPLEX)
    {
        ffpkym(fptr, keyname, (double *) value, -15, comm, status);
    }
    else
    {
        snprintf(errmsg, FLEN_ERRMSG,"Bad keyword datatype code: %d (ffpky)", datatype);
        ffpmsg(errmsg);
        *status = BAD_DATATYPE;
    }

    return(*status);
}